

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

int lj_gc_step_jit(global_State *g,MSize steps)

{
  char cVar1;
  lua_State *L;
  TValue *pTVar2;
  int iVar3;
  int iVar4;
  
  L = (lua_State *)(g->cur_L).gcptr64;
  pTVar2 = *(TValue **)((L->glref).ptr64 + 0x178);
  L->base = pTVar2;
  L->top = pTVar2 + *(byte *)(*(long *)((pTVar2[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  iVar4 = steps + 1;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) break;
    iVar3 = lj_gc_step(L);
  } while (iVar3 == 0);
  cVar1 = *(char *)((L->glref).ptr64 + 0x21);
  return (int)(cVar1 == '\x05' || cVar1 == '\x02');
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->cur_L));
  L->base = tvref(G(L)->jit_base);
  L->top = curr_topL(L);
  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}